

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curve.h
# Opt level: O2

Vector * __thiscall
anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>::point_at
          (Vector *__return_storage_ptr__,
          Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *this,double t)

{
  Pointer<anurbs::NurbsCurveGeometry<3L>_> PVar1;
  Ref<anurbs::NurbsCurveGeometry<3L>_> local_20;
  
  PVar1 = Ref<anurbs::NurbsCurveGeometry<3L>_>::data(&local_20);
  (*((local_20.m_entry.
      super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_EntryBase)._vptr_EntryBase[5])
            (t,__return_storage_ptr__,
             local_20.m_entry.
             super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,PVar1.
                     super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._M_pi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Vector point_at(const double t) const override
    {
        return m_curve_geometry->point_at(t);
    }